

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int arkSetErrorBias(void *arkode_mem,realtype bias)

{
  int iVar1;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem local_20;
  double local_18;
  ARKodeMem local_8;
  
  local_18 = bias;
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetErrorBias",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->bias =
         (realtype)
         (~-(ulong)(local_18 < 1.0) & (ulong)local_18 |
         -(ulong)(local_18 < 1.0) & 0x3ff8000000000000);
  }
  return iVar1;
}

Assistant:

int arkSetErrorBias(void *arkode_mem, realtype bias)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetErrorBias",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set allowed value, otherwise set default */
  if (bias < ONE) {
    hadapt_mem->bias = BIAS;
  } else {
    hadapt_mem->bias = bias;
  }

  return(ARK_SUCCESS);
}